

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
DepfileParserTestMultipleEmptyRules::DepfileParserTestMultipleEmptyRules
          (DepfileParserTestMultipleEmptyRules *this)

{
  DepfileParserTestMultipleEmptyRules *this_local;
  
  DepfileParserTest::DepfileParserTest(&this->super_DepfileParserTest);
  (this->super_DepfileParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DepfileParserTestMultipleEmptyRules_002a47d8;
  return;
}

Assistant:

TEST_F(DepfileParserTest, MultipleEmptyRules) {
  string err;
  EXPECT_TRUE(Parse("foo: x\n"
                    "foo: \n"
                    "foo:\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(1u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
}